

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
booster::locale::basic_format<char>::format_output
          (basic_format<char> *this,stream_type *out,string_type *sformat)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  code *pcVar6;
  pointer pfVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  void *pvVar11;
  format_guard guard;
  string key;
  format_parser fmt;
  string svalue;
  string_type value;
  format_guard local_c8;
  ulong local_b8;
  string local_b0;
  format_parser local_90 [16];
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  formattible_type *local_40;
  basic_format<char> *local_38;
  
  pcVar2 = (sformat->_M_dataplus)._M_p;
  local_b8 = sformat->_M_string_length;
  local_40 = this->parameters_;
  uVar8 = 0;
  local_38 = this;
LAB_0011adf2:
  do {
    while( true ) {
      cVar4 = pcVar2[uVar8];
      if (cVar4 != '{') break;
      uVar9 = uVar8 + 1;
      if ((local_b8 <= uVar9) || (pcVar2[uVar9] != '{')) {
        booster::locale::details::format_parser::format_parser
                  (local_90,(ios_base *)(out + *(long *)(*(long *)out + -0x18)),out,imbue_locale);
        local_c8.restored_ = false;
        local_c8.fmt_ = local_90;
LAB_0011ae90:
        if (uVar9 < local_b8) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          local_80 = local_70;
          local_78 = 0;
          local_70[0] = 0;
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          local_60._M_string_length = 0;
          local_60.field_2._M_local_buf[0] = '\0';
          do {
            bVar1 = pcVar2[uVar9];
            if (bVar1 < 0x3d) {
              if ((bVar1 == 0) || (bVar1 == 0x2c)) goto LAB_0011af98;
            }
            else {
              if (bVar1 == 0x3d) {
                cVar4 = pcVar2[uVar9 + 1];
                uVar8 = uVar9;
                if (cVar4 != '\'') goto LAB_0011af70;
                uVar9 = uVar9 + 2;
                goto LAB_0011af29;
              }
              if (bVar1 == 0x7d) goto LAB_0011af98;
            }
            std::__cxx11::string::push_back((char)&local_b0);
            uVar9 = uVar9 + 1;
          } while( true );
        }
        goto LAB_0011b0af;
      }
      local_b0._M_dataplus._M_p._0_1_ = 0x7b;
LAB_0011ae4b:
      std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
      uVar8 = uVar8 + 2;
    }
    if (cVar4 == '}') {
      if (pcVar2[uVar8 + 1] == '}') {
        local_b0._M_dataplus._M_p._0_1_ = 0x7d;
        goto LAB_0011ae4b;
      }
    }
    else if (cVar4 == '\0') {
      return;
    }
    local_b0._M_dataplus._M_p._0_1_ = cVar4;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_b0,1);
    uVar8 = uVar8 + 1;
  } while( true );
LAB_0011af70:
  while (((uVar9 = uVar8 + 1, cVar4 != '\0' && (cVar4 != ',')) && (cVar4 != '}'))) {
    std::__cxx11::string::push_back((char)&local_80);
    cVar4 = pcVar2[uVar8 + 2];
    uVar8 = uVar9;
  }
LAB_0011af98:
  booster::locale::details::format_parser::set_one_flag((string *)local_90,(string *)&local_b0);
LAB_0011afaa:
  if (pcVar2[uVar9] == '}') {
    uVar5 = booster::locale::details::format_parser::get_position();
    if (uVar5 < local_38->parameters_count_) {
      pfVar7 = (local_38->ext_params_).
               super__Vector_base<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (uVar5 - 8);
      if (uVar5 < 8) {
        pfVar7 = local_40 + uVar5;
      }
      pvVar11 = pfVar7->pointer_;
      pcVar6 = pfVar7->writer_;
    }
    else {
      pcVar6 = details::formattible<char>::void_write;
      pvVar11 = (void *)0x0;
    }
    (*pcVar6)(out,pvVar11);
    if (local_c8.restored_ == false) {
      booster::locale::details::format_parser::restore();
      local_c8.restored_ = true;
    }
    uVar9 = uVar9 + 1;
  }
  else {
    if (pcVar2[uVar9] == ',') {
      uVar9 = uVar9 + 1;
      bVar3 = true;
      goto LAB_0011b04d;
    }
    if (local_c8.restored_ == false) {
      booster::locale::details::format_parser::restore();
      local_c8.restored_ = true;
    }
  }
  bVar3 = false;
LAB_0011b04d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (!bVar3) goto LAB_0011b0af;
  goto LAB_0011ae90;
LAB_0011af29:
  cVar4 = (char)&local_60;
  if (pcVar2[uVar9] != '\'') {
    if (pcVar2[uVar9] == '\0') goto LAB_0011b09a;
    lVar10 = 1;
    std::__cxx11::string::push_back(cVar4);
LAB_0011af6b:
    uVar9 = uVar9 + lVar10;
    goto LAB_0011af29;
  }
  if (pcVar2[uVar9 + 1] == '\'') {
    lVar10 = 2;
    std::__cxx11::string::push_back(cVar4);
    goto LAB_0011af6b;
  }
  uVar9 = uVar9 + 1;
LAB_0011b09a:
  details::format_parser::set_flag_with_str<char>(local_90,&local_b0,&local_60);
  goto LAB_0011afaa;
LAB_0011b0af:
  format_guard::~format_guard(&local_c8);
  booster::locale::details::format_parser::~format_parser(local_90);
  uVar8 = uVar9;
  goto LAB_0011adf2;
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }